

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::TaskSet::TaskSet(TaskSet *this,ErrorHandler *errorHandler,SourceLocation location)

{
  this->errorHandler = errorHandler;
  (this->tasks).ptr.ptr = (Task *)0x0;
  (this->emptyFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->emptyFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->location).fileName = location.fileName;
  (this->location).function = location.function;
  (this->location).lineNumber = location.lineNumber;
  (this->location).columnNumber = location.columnNumber;
  return;
}

Assistant:

TaskSet::TaskSet(TaskSet::ErrorHandler& errorHandler, SourceLocation location)
  : errorHandler(errorHandler), location(location) {}